

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

ARCHIVE_DEVICE_DATA_FLAGS Diligent::RenderDeviceTypeToArchiveDataFlag(RENDER_DEVICE_TYPE DevType)

{
  string msg;
  string local_28;
  
  switch(DevType) {
  case RENDER_DEVICE_TYPE_D3D11:
  case RENDER_DEVICE_TYPE_D3D12:
    break;
  case RENDER_DEVICE_TYPE_GL:
    DevType = RENDER_DEVICE_TYPE_GLES;
    break;
  case RENDER_DEVICE_TYPE_GLES:
    DevType = RENDER_DEVICE_TYPE_COUNT;
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    DevType = 0x10;
    break;
  case RENDER_DEVICE_TYPE_METAL:
    FormatString<char[40]>(&local_28,(char (*) [40])"Metal is not supported on this platform");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"RenderDeviceTypeToArchiveDataFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x782);
    goto LAB_002fa8a9;
  case RENDER_DEVICE_TYPE_WEBGPU:
    DevType = 0x80;
    break;
  default:
    FormatString<char[23]>(&local_28,(char (*) [23])"Unexpected device type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"RenderDeviceTypeToArchiveDataFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x78a);
LAB_002fa8a9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    DevType = RENDER_DEVICE_TYPE_UNDEFINED;
  }
  return DevType;
}

Assistant:

ARCHIVE_DEVICE_DATA_FLAGS RenderDeviceTypeToArchiveDataFlag(RENDER_DEVICE_TYPE DevType)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Please update the switch below to handle the new device type");
    switch (DevType)
    {
        case RENDER_DEVICE_TYPE_D3D11:
            return ARCHIVE_DEVICE_DATA_FLAG_D3D11;

        case RENDER_DEVICE_TYPE_D3D12:
            return ARCHIVE_DEVICE_DATA_FLAG_D3D12;

        case RENDER_DEVICE_TYPE_GL:
            return ARCHIVE_DEVICE_DATA_FLAG_GL;

        case RENDER_DEVICE_TYPE_GLES:
            return ARCHIVE_DEVICE_DATA_FLAG_GLES;

        case RENDER_DEVICE_TYPE_VULKAN:
            return ARCHIVE_DEVICE_DATA_FLAG_VULKAN;

        case RENDER_DEVICE_TYPE_METAL:
#if PLATFORM_MACOS
            return ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS;
#elif PLATFORM_IOS
            return ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS;
#else
            UNEXPECTED("Metal is not supported on this platform");
            return ARCHIVE_DEVICE_DATA_FLAG_NONE;
#endif

        case RENDER_DEVICE_TYPE_WEBGPU:
            return ARCHIVE_DEVICE_DATA_FLAG_WEBGPU;

        default:
            UNEXPECTED("Unexpected device type");
            return ARCHIVE_DEVICE_DATA_FLAG_NONE;
    }
}